

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::PrecalculateTileInfo
               (vector<int,_std::allocator<int>_> *num_x_tiles,
               vector<int,_std::allocator<int>_> *num_y_tiles,EXRHeader *exr_header)

{
  size_type in_RDX;
  EXRHeader *in_RSI;
  int num_y_levels;
  int num_x_levels;
  int max_y;
  int min_y;
  int max_x;
  int min_x;
  int tile_rounding_mode;
  
  tile_rounding_mode = *(int *)(in_RDX + 8);
  CalculateNumXLevels(in_RSI);
  CalculateNumYLevels(in_RSI);
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)in_RSI,in_RDX)
  ;
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)in_RSI,in_RDX)
  ;
  CalculateNumTiles((vector<int,_std::allocator<int>_> *)in_RSI,(int)(in_RDX >> 0x20),(int)in_RDX,
                    tile_rounding_mode);
  CalculateNumTiles((vector<int,_std::allocator<int>_> *)in_RSI,(int)(in_RDX >> 0x20),(int)in_RDX,
                    tile_rounding_mode);
  return;
}

Assistant:

static void PrecalculateTileInfo(std::vector<int>& num_x_tiles,
  std::vector<int>& num_y_tiles,
  const EXRHeader* exr_header) {
  int min_x = exr_header->data_window.min_x;
  int max_x = exr_header->data_window.max_x;
  int min_y = exr_header->data_window.min_y;
  int max_y = exr_header->data_window.max_y;

  int num_x_levels = CalculateNumXLevels(exr_header);
  int num_y_levels = CalculateNumYLevels(exr_header);

  num_x_tiles.resize(size_t(num_x_levels));
  num_y_tiles.resize(size_t(num_y_levels));

  CalculateNumTiles(num_x_tiles,
    max_x - min_x + 1,
    exr_header->tile_size_x,
    exr_header->tile_rounding_mode);

  CalculateNumTiles(num_y_tiles,
    max_y - min_y + 1,
    exr_header->tile_size_y,
    exr_header->tile_rounding_mode);
}